

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

bool __thiscall
duckdb::DictionaryAnalyzeState::CalculateSpaceRequirements
          (DictionaryAnalyzeState *this,bool new_string,idx_t string_size)

{
  idx_t iVar1;
  bitpacking_width_t packing_width;
  idx_t iVar2;
  undefined7 in_register_00000031;
  idx_t iVar3;
  idx_t dict_size;
  
  if ((int)CONCAT71(in_register_00000031,new_string) == 0) {
    iVar1 = this->current_tuple_count;
    iVar3 = this->current_unique_count;
    dict_size = this->current_dict_size;
    packing_width = this->current_width;
    iVar2 = CompressionInfo::GetBlockSize
                      (&(this->super_DictionaryCompressionState).super_CompressionState.info);
  }
  else {
    packing_width =
         BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(this->current_unique_count + 2);
    this->next_width = packing_width;
    iVar1 = this->current_tuple_count;
    iVar3 = this->current_unique_count + 1;
    dict_size = string_size + this->current_dict_size;
    iVar2 = CompressionInfo::GetBlockSize
                      (&(this->super_DictionaryCompressionState).super_CompressionState.info);
  }
  iVar3 = DictionaryCompression::RequiredSpace(iVar1 + 1,iVar3,dict_size,packing_width);
  return iVar3 <= iVar2;
}

Assistant:

bool DictionaryAnalyzeState::CalculateSpaceRequirements(bool new_string, idx_t string_size) {
	if (!new_string) {
		return DictionaryCompression::HasEnoughSpace(current_tuple_count + 1, current_unique_count, current_dict_size,
		                                             current_width, info.GetBlockSize());
	}
	next_width = BitpackingPrimitives::MinimumBitWidth(current_unique_count + 2); // 1 for null, one for new string
	return DictionaryCompression::HasEnoughSpace(current_tuple_count + 1, current_unique_count + 1,
	                                             current_dict_size + string_size, next_width, info.GetBlockSize());
}